

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H28_linked_list.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  puVar1 = (undefined8 *)malloc(0x10);
  *(undefined4 *)(puVar1 + 1) = 1;
  puVar2 = (undefined8 *)malloc(0x10);
  *(undefined4 *)(puVar2 + 1) = 2;
  puVar3 = (undefined8 *)malloc(0x10);
  *puVar3 = 0;
  *(undefined4 *)(puVar3 + 1) = 3;
  *puVar1 = puVar2;
  *puVar2 = puVar3;
  do {
    printf("%d\n",(ulong)*(uint *)(puVar1 + 1));
    puVar1 = (undefined8 *)*puVar1;
  } while (puVar1 != (undefined8 *)0x0);
  return 0;
}

Assistant:

struct CELL *create(DATATYPE data) {
  struct CELL *p = (struct CELL *)malloc(sizeof(struct CELL));
  p->next = NULL;
  p->data = data;

  return p;
}